

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O1

QString * qdtoa(QString *__return_storage_ptr__,qreal d,int *decpt,int *sign)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  qsizetype qVar5;
  QString *this;
  storage_type *psVar6;
  long in_FS_OFFSET;
  QByteArrayView ba;
  int length;
  int nonNullDecpt;
  bool nonNullSign;
  uint local_64;
  int local_60;
  bool local_59;
  QString local_58;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined2 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_59 = false;
  local_60 = 0;
  local_64 = 0;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = 0xaaaa;
  psVar6 = (storage_type *)0x12;
  qt_doubleToAscii(d,DFSignificantDigits,-0x80,(char *)&local_38,0x12,&local_59,(int *)&local_64,
                   &local_60);
  if (sign != (int *)0x0) {
    *sign = (uint)local_59;
  }
  if (decpt != (int *)0x0) {
    *decpt = local_60;
  }
  this = (QString *)0x0;
  if (0 < (int)local_64) {
    this = (QString *)(ulong)local_64;
  }
  if ((int)local_64 < 0) {
    this = (QString *)strlen((char *)&local_38);
  }
  ba.m_data = psVar6;
  ba.m_size = (qsizetype)&local_38;
  QString::fromLatin1(&local_58,this,ba);
  qVar5 = local_58.d.size;
  uVar1 = local_58.d.d._0_4_;
  uVar2 = local_58.d.d._4_4_;
  uVar3 = local_58.d.ptr._0_4_;
  uVar4 = local_58.d.ptr._4_4_;
  local_58.d.d = (Data *)0x0;
  local_58.d.ptr = (char16_t *)0x0;
  *(undefined4 *)&(__return_storage_ptr__->d).d = uVar1;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = uVar2;
  *(undefined4 *)&(__return_storage_ptr__->d).ptr = uVar3;
  *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = uVar4;
  local_58.d.size = 0;
  (__return_storage_ptr__->d).size = qVar5;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString qdtoa(qreal d, int *decpt, int *sign)
{
    bool nonNullSign = false;
    int nonNullDecpt = 0;
    int length = 0;

    // Some versions of libdouble-conversion like an extra digit, probably for '\0'
    constexpr qsizetype digits = std::numeric_limits<double>::max_digits10 + 1;
    char result[digits];
    qt_doubleToAscii(d, QLocaleData::DFSignificantDigits, QLocale::FloatingPointShortest,
                     result, digits, nonNullSign, length, nonNullDecpt);

    if (sign)
        *sign = nonNullSign ? 1 : 0;
    if (decpt)
        *decpt = nonNullDecpt;

    return QLatin1StringView(result, length);
}